

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moving_sphere.h
# Opt level: O3

bool __thiscall
moving_sphere::hit(moving_sphere *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar5 = (r->tm - this->time0) / (this->time1 - this->time0);
  dVar6 = (this->center0).e[0];
  dVar8 = (this->center0).e[1];
  dVar2 = (this->center0).e[2];
  dVar9 = (r->orig).e[0] - (((this->center1).e[0] - dVar6) * dVar5 + dVar6);
  dVar3 = (r->orig).e[1] - (((this->center1).e[1] - dVar8) * dVar5 + dVar8);
  dVar5 = (r->orig).e[2] - (((this->center1).e[2] - dVar2) * dVar5 + dVar2);
  dVar6 = (r->dir).e[0];
  dVar8 = (r->dir).e[1];
  dVar2 = (r->dir).e[2];
  dVar7 = dVar2 * dVar2 + dVar6 * dVar6 + dVar8 * dVar8;
  dVar8 = dVar9 * dVar6 + dVar3 * dVar8 + dVar5 * dVar2;
  dVar6 = dVar8 * dVar8 -
          ((dVar5 * dVar5 + dVar9 * dVar9 + dVar3 * dVar3) - this->radius * this->radius) * dVar7;
  if (dVar6 <= 0.0) {
    return false;
  }
  dVar5 = SQRT(dVar6);
  dVar2 = dVar5;
  if (dVar6 < 0.0) {
    dVar2 = sqrt(dVar6);
  }
  if (dVar6 < 0.0) {
    dVar5 = sqrt(dVar6);
  }
  dVar6 = (-dVar8 - dVar5) / dVar7;
  if ((t_max <= dVar6) || (dVar6 <= t_min)) {
    dVar6 = (dVar2 - dVar8) / dVar7;
    if (t_max <= dVar6) {
      return false;
    }
    if (dVar6 <= t_min) {
      return false;
    }
  }
  rec->t = dVar6;
  dVar8 = (r->dir).e[2] * dVar6 + (r->orig).e[2];
  dVar7 = dVar6 * (r->dir).e[0] + (r->orig).e[0];
  dVar9 = dVar6 * (r->dir).e[1] + (r->orig).e[1];
  (rec->p).e[0] = dVar7;
  (rec->p).e[1] = dVar9;
  (rec->p).e[2] = dVar8;
  dVar3 = (r->tm - this->time0) / (this->time1 - this->time0);
  dVar6 = (this->center0).e[2];
  dVar5 = 1.0 / this->radius;
  dVar2 = (dVar8 - (((this->center1).e[2] - dVar6) * dVar3 + dVar6)) * dVar5;
  dVar6 = (this->center0).e[0];
  dVar8 = (this->center0).e[1];
  dVar6 = dVar5 * (dVar7 - (dVar3 * ((this->center1).e[0] - dVar6) + dVar6));
  dVar5 = dVar5 * (dVar9 - (dVar3 * ((this->center1).e[1] - dVar8) + dVar8));
  dVar8 = (r->dir).e[2] * dVar2 + (r->dir).e[0] * dVar6 + dVar5 * (r->dir).e[1];
  rec->front_face = dVar8 < 0.0;
  if (0.0 <= dVar8) {
    dVar2 = -dVar2;
  }
  uVar1 = (uint)(dVar8 < 0.0);
  auVar4._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar4._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar4._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  (rec->normal).e[0] = (double)(~auVar4._0_8_ & (ulong)-dVar6 | (ulong)dVar6 & auVar4._0_8_);
  (rec->normal).e[1] = (double)(~auVar4._8_8_ & (ulong)-dVar5 | (ulong)dVar5 & auVar4._8_8_);
  (rec->normal).e[2] = dVar2;
  (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool moving_sphere::hit(const ray& r, double t_min, double t_max, hit_record& rec) const{
    vec3 oc = r.origin() - center(r.time());
    auto a = r.direction().length_squared();
    auto half_b = dot(oc,r.direction());
    auto c = oc.length_squared() - radius * radius;
    auto discriminant = half_b * half_b - a * c;

    if (discriminant > 0) {
        auto root = sqrt(discriminant);
        auto temp = (-half_b - sqrt(discriminant)) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }

        temp = (-half_b + root) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }
    }

    return false;
}